

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests.c
# Opt level: O0

void test_kx_kk(void)

{
  _Bool _Var1;
  hydro_kx_session_keypair kp_server;
  hydro_kx_session_keypair kp_client;
  uint8_t packet2 [48];
  uint8_t packet1 [48];
  hydro_kx_keypair server_static_kp;
  hydro_kx_keypair client_static_kp;
  hydro_kx_state st_client;
  undefined1 auStack_1d8 [8];
  hydro_kx_keypair *in_stack_fffffffffffffe30;
  uint8_t *in_stack_fffffffffffffe38;
  hydro_kx_session_keypair *in_stack_fffffffffffffe40;
  hydro_kx_state *in_stack_fffffffffffffe48;
  undefined1 local_198 [32];
  undefined1 auStack_178 [48];
  hydro_kx_keypair *in_stack_fffffffffffffeb8;
  uint8_t *in_stack_fffffffffffffec0;
  uint8_t *in_stack_fffffffffffffec8;
  uint8_t *in_stack_fffffffffffffed0;
  hydro_kx_session_keypair *in_stack_fffffffffffffed8;
  
  hydro_kx_keygen((hydro_kx_keypair *)0x102fe4);
  hydro_kx_keygen((hydro_kx_keypair *)0x102ff1);
  hydro_kx_kk_1(in_stack_fffffffffffffe48,in_stack_fffffffffffffe40->rx,in_stack_fffffffffffffe38,
                in_stack_fffffffffffffe30);
  hydro_kx_kk_2(in_stack_fffffffffffffed8,in_stack_fffffffffffffed0,in_stack_fffffffffffffec8,
                in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8);
  hydro_kx_kk_3(in_stack_fffffffffffffe48,in_stack_fffffffffffffe40,in_stack_fffffffffffffe38,
                in_stack_fffffffffffffe30);
  _Var1 = hydro_equal(auStack_178,auStack_1d8,0x20);
  if (!_Var1) {
    __assert_fail("hydro_equal(kp_client.tx, kp_server.rx, hydro_kx_SESSIONKEYBYTES)",
                  "/workspace/llm4binary/github/license_c_cmakelists/jedisct1[P]libhydrogen/tests/tests.c"
                  ,0x156,"void test_kx_kk(void)");
  }
  _Var1 = hydro_equal(local_198,&stack0xfffffffffffffe48,0x20);
  if (!_Var1) {
    __assert_fail("hydro_equal(kp_client.rx, kp_server.tx, hydro_kx_SESSIONKEYBYTES)",
                  "/workspace/llm4binary/github/license_c_cmakelists/jedisct1[P]libhydrogen/tests/tests.c"
                  ,0x157,"void test_kx_kk(void)");
  }
  return;
}

Assistant:

static void
test_kx_kk(void)
{
    hydro_kx_state           st_client;
    hydro_kx_keypair         client_static_kp;
    hydro_kx_keypair         server_static_kp;
    uint8_t                  packet1[hydro_kx_KK_PACKET1BYTES];
    uint8_t                  packet2[hydro_kx_KK_PACKET2BYTES];
    hydro_kx_session_keypair kp_client;
    hydro_kx_session_keypair kp_server;

    hydro_kx_keygen(&client_static_kp);
    hydro_kx_keygen(&server_static_kp);

    hydro_kx_kk_1(&st_client, packet1, server_static_kp.pk, &client_static_kp);
    hydro_kx_kk_2(&kp_server, packet2, packet1, client_static_kp.pk, &server_static_kp);
    hydro_kx_kk_3(&st_client, &kp_client, packet2, &client_static_kp);

    assert(hydro_equal(kp_client.tx, kp_server.rx, hydro_kx_SESSIONKEYBYTES));
    assert(hydro_equal(kp_client.rx, kp_server.tx, hydro_kx_SESSIONKEYBYTES));
}